

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_method.c
# Opt level: O3

value method_metadata(method_conflict m)

{
  char *__s;
  value v;
  value *ppvVar1;
  value pvVar2;
  size_t length;
  value pvVar3;
  value pvVar4;
  value v_00;
  
  v = value_create_array((value *)0x0,2);
  if (v != (value)0x0) {
    ppvVar1 = value_to_array(v);
    pvVar2 = value_create_string("name",4);
    *ppvVar1 = pvVar2;
    if (pvVar2 != (value)0x0) {
      __s = m->name;
      length = strlen(__s);
      pvVar2 = value_create_string(__s,length);
      ppvVar1[1] = pvVar2;
      if ((pvVar2 != (value)0x0) &&
         (pvVar2 = value_create_array((value *)0x0,2), pvVar2 != (value)0x0)) {
        ppvVar1 = value_to_array(pvVar2);
        pvVar3 = value_create_string("signature",9);
        *ppvVar1 = pvVar3;
        if (pvVar3 != (value)0x0) {
          pvVar3 = signature_metadata(m->s);
          ppvVar1[1] = pvVar3;
          if ((pvVar3 != (value)0x0) &&
             (pvVar3 = value_create_array((value *)0x0,2), pvVar3 != (value)0x0)) {
            ppvVar1 = value_to_array(pvVar3);
            pvVar4 = value_create_string("async",5);
            *ppvVar1 = pvVar4;
            if (pvVar4 != (value)0x0) {
              pvVar4 = value_create_bool('\0');
              ppvVar1[1] = pvVar4;
              if ((pvVar4 != (value)0x0) &&
                 (pvVar4 = class_visibility_value_pair(m->visibility), pvVar4 != (value)0x0)) {
                v_00 = value_create_map((value *)0x0,4);
                if (v_00 != (value)0x0) {
                  ppvVar1 = value_to_map(v_00);
                  *ppvVar1 = v;
                  ppvVar1[1] = pvVar2;
                  ppvVar1[2] = pvVar3;
                  ppvVar1[3] = pvVar4;
                  return v_00;
                }
                value_type_destroy(pvVar4);
              }
            }
            value_type_destroy(pvVar3);
          }
        }
        value_type_destroy(pvVar2);
      }
    }
    value_type_destroy(v);
  }
  return (value)0x0;
}

Assistant:

value method_metadata(method m)
{
	value name, sig, async, visibility, metatada;
	value *m_map;

	/* Create method name array */
	name = method_metadata_name(m);

	if (name == NULL)
	{
		goto error_name;
	}

	/* Create signature array */
	sig = method_metadata_signature(m);

	if (sig == NULL)
	{
		goto error_signature;
	}

	/* Create method async array */
	async = method_metadata_async(m);

	if (async == NULL)
	{
		goto error_async;
	}

	/* Create method visibility array */
	visibility = method_metadata_visibility(m);

	if (visibility == NULL)
	{
		goto error_visibility;
	}

	/* Create method map (name + signature + async + visibility) */
	metatada = value_create_map(NULL, 4);

	if (metatada == NULL)
	{
		goto error_method;
	}

	m_map = value_to_map(metatada);

	m_map[0] = name;
	m_map[1] = sig;
	m_map[2] = async;
	m_map[3] = visibility;

	return metatada;

error_method:
	value_type_destroy(visibility);
error_visibility:
	value_type_destroy(async);
error_async:
	value_type_destroy(sig);
error_signature:
	value_type_destroy(name);
error_name:
	return NULL;
}